

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerUtil.cpp
# Opt level: O1

shared_ptr<opentracing::v3::Tracer> __thiscall
jaegertracing::testutils::TracerUtil::buildTracer(TracerUtil *this,string *endpoint)

{
  pointer pcVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<opentracing::v3::Tracer> sVar2;
  undefined1 *local_570;
  long local_568;
  undefined1 local_560 [16];
  duration local_550;
  undefined1 local_548 [8];
  _Alloc_hider local_540;
  char local_530 [16];
  duration local_520;
  string local_518;
  string local_4f8;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_4d8;
  string local_4c0;
  duration local_4a0;
  string local_498;
  Config local_478;
  undefined1 local_420 [128];
  NullStatsFactory factory;
  _Alloc_hider local_388;
  char local_378 [16];
  _Alloc_hider local_368;
  char local_358 [16];
  ostringstream samplingServerURLStream;
  ios_base local_2d8 [264];
  Config config;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&samplingServerURLStream);
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"const","");
  std::__cxx11::stringbuf::str();
  local_4a0.__r = 0;
  samplers::Config::Config(&local_478,&local_4f8,1.0,&local_498,0,&local_4a0);
  local_550.__r = 100000000;
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_518);
  reporters::Config::Config((Config *)&factory,0,&local_550,false,&local_518,endpoint);
  propagation::HeadersConfig::HeadersConfig((HeadersConfig *)local_420);
  local_570 = local_560;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"");
  local_548[0] = false;
  local_540._M_p = local_530;
  std::__cxx11::string::_M_construct<char*>((string *)&local_540,local_570,local_570 + local_568);
  local_520.__r = 0;
  local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0);
  local_4d8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4d8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4d8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Config::Config(&config,false,&local_478,(Config *)&factory,(HeadersConfig *)local_420,
                 (RestrictionsConfig *)local_548,&local_4c0,&local_4d8);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p);
  }
  if (local_540._M_p != local_530) {
    operator_delete(local_540._M_p);
  }
  if (local_570 != local_560) {
    operator_delete(local_570);
  }
  if ((undefined1 *)local_420._96_8_ != local_420 + 0x70) {
    operator_delete((void *)local_420._96_8_);
  }
  if ((undefined1 *)local_420._64_8_ != local_420 + 0x50) {
    operator_delete((void *)local_420._64_8_);
  }
  if ((undefined1 *)local_420._32_8_ != local_420 + 0x30) {
    operator_delete((void *)local_420._32_8_);
  }
  pcVar1 = local_420 + 0x10;
  if ((pointer)local_420._0_8_ != pcVar1) {
    operator_delete((void *)local_420._0_8_);
  }
  if (local_368._M_p != local_358) {
    operator_delete(local_368._M_p);
  }
  if (local_388._M_p != local_378) {
    operator_delete(local_388._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._samplingServerURL._M_dataplus._M_p != &local_478._samplingServerURL.field_2) {
    operator_delete(local_478._samplingServerURL._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._type._M_dataplus._M_p != &local_478._type.field_2) {
    operator_delete(local_478._type._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p);
  }
  local_420._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"test-service","");
  jaegertracing::logging::nullLogger();
  std::__shared_ptr<jaegertracing::logging::Logger,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<jaegertracing::logging::Logger,std::default_delete<jaegertracing::logging::Logger>,void>
            ((__shared_ptr<jaegertracing::logging::Logger,(__gnu_cxx::_Lock_policy)2> *)&local_478,
             (unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
              *)local_548);
  factory.super_StatsFactory._vptr_StatsFactory = (StatsFactory)&PTR__StatsFactory_0015a6d8;
  jaegertracing::Tracer::make
            ((string *)this,(Config *)local_420,(shared_ptr *)&config,(StatsFactory *)&local_478,
             (int)&factory);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_478._type._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_478._type._M_string_length);
  }
  if ((long *)CONCAT71(local_548._1_7_,local_548[0]) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_548._1_7_,local_548[0]) + 8))();
  }
  if ((pointer)local_420._0_8_ != pcVar1) {
    operator_delete((void *)local_420._0_8_);
  }
  Config::~Config(&config);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&samplingServerURLStream);
  std::ios_base::~ios_base(local_2d8);
  sVar2.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<opentracing::v3::Tracer>)
         sVar2.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<opentracing::Tracer> buildTracer(const std::string& endpoint)
{
    std::ostringstream samplingServerURLStream;
    Config config(
        false,
        samplers::Config("const",
                         1,
                         samplingServerURLStream.str(),
                         0,
                         samplers::Config::Clock::duration()),
        reporters::Config(0,
                          std::chrono::milliseconds(100),
                          false, "", endpoint),
        propagation::HeadersConfig(),
        baggage::RestrictionsConfig());

    auto tracer = Tracer::make("test-service", config, logging::nullLogger());
    return tracer;
}